

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall re2::ByteMapBuilder::Merge(ByteMapBuilder *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pointer ppVar7;
  
  ppVar7 = (this->ranges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ppVar7 != (this->ranges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar6 = ppVar7->first;
      uVar1 = ppVar7->second;
      if (0 < iVar6) {
        uVar5 = iVar6 - 1;
        uVar3 = iVar6 + 0x3e;
        if (-1 < (int)uVar5) {
          uVar3 = uVar5;
        }
        uVar2 = (this->splits_).words_[(int)uVar3 >> 6];
        if ((uVar2 >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
          (this->splits_).words_[(int)uVar3 >> 6] = uVar2 | 1L << ((byte)uVar5 & 0x3f);
          iVar4 = Bitmap256::FindNextSetBit(&this->splits_,iVar6);
          this->colors_[uVar5] = this->colors_[iVar4];
        }
      }
      uVar5 = uVar1 + 0x3f;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar2 = (this->splits_).words_[(int)uVar5 >> 6];
      if ((uVar2 >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
        (this->splits_).words_[(int)uVar5 >> 6] = uVar2 | 1L << ((byte)uVar1 & 0x3f);
        iVar4 = Bitmap256::FindNextSetBit(&this->splits_,uVar1 + 1);
        this->colors_[(int)uVar1] = this->colors_[iVar4];
      }
      do {
        if (0xff < iVar6) break;
        uVar5 = Bitmap256::FindNextSetBit(&this->splits_,iVar6);
        iVar6 = Recolor(this,this->colors_[(int)uVar5]);
        this->colors_[(int)uVar5] = iVar6;
        iVar6 = uVar5 + 1;
      } while (uVar5 != uVar1);
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != (this->ranges_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppVar7 = (this->colormap_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colormap_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar7) {
    (this->colormap_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  ppVar7 = (this->ranges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ranges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    (this->ranges_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  return;
}

Assistant:

void ByteMapBuilder::Merge() {
  for (std::vector<std::pair<int, int>>::const_iterator it = ranges_.begin();
       it != ranges_.end();
       ++it) {
    int lo = it->first-1;
    int hi = it->second;

    if (0 <= lo && !splits_.Test(lo)) {
      splits_.Set(lo);
      int next = splits_.FindNextSetBit(lo+1);
      colors_[lo] = colors_[next];
    }
    if (!splits_.Test(hi)) {
      splits_.Set(hi);
      int next = splits_.FindNextSetBit(hi+1);
      colors_[hi] = colors_[next];
    }

    int c = lo+1;
    while (c < 256) {
      int next = splits_.FindNextSetBit(c);
      colors_[next] = Recolor(colors_[next]);
      if (next == hi)
        break;
      c = next+1;
    }
  }
  colormap_.clear();
  ranges_.clear();
}